

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  int iVar1;
  ulong uVar2;
  Rep *pRVar3;
  CategoricalCrossEntropyLossLayer *pCVar4;
  NetworkUpdateParameters *pNVar5;
  LossLayer *pLVar6;
  MeanSquaredErrorLossLayer *pMVar7;
  LogMessage *other;
  ModelDescription *pMVar8;
  FeatureDescription *pFVar9;
  undefined8 *puVar10;
  Arena *pAVar11;
  undefined1 *puVar12;
  FeatureDescription output;
  LogFinisher local_99;
  FeatureDescription local_98;
  LogMessage local_68;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    uVar2 = (nn->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pNVar5 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar11);
    nn->updateparams_ = pNVar5;
  }
  pNVar5 = nn->updateparams_;
  pRVar3 = (pNVar5->losslayers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001c2507:
    pLVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LossLayer>
                       ((pNVar5->losslayers_).super_RepeatedPtrFieldBase.arena_);
    pLVar6 = (LossLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(pNVar5->losslayers_).super_RepeatedPtrFieldBase,pLVar6);
  }
  else {
    iVar1 = (pNVar5->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001c2507;
    (pNVar5->losslayers_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pLVar6 = (LossLayer *)pRVar3->elements[iVar1];
  }
  uVar2 = (pLVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pLVar6->name_,lossName,puVar10);
  if (pLVar6->_oneof_case_[0] != 0xb) {
    CoreML::Specification::LossLayer::clear_LossLayerType(pLVar6);
    pLVar6->_oneof_case_[0] = 0xb;
    uVar2 = (pLVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pMVar7 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::MeanSquaredErrorLossLayer>(pAVar11);
    (pLVar6->LossLayerType_).meansquarederrorlosslayer_ = pMVar7;
  }
  pCVar4 = (pLVar6->LossLayerType_).categoricalcrossentropylosslayer_;
  uVar2 = (pCVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pCVar4->input_,mseInputName,puVar10);
  uVar2 = (pCVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pCVar4->target_,targetName,puVar10)
  ;
  puVar12 = (undefined1 *)m->description_;
  if ((ModelDescription *)puVar12 == (ModelDescription *)0x0) {
    puVar12 = CoreML::Specification::_ModelDescription_default_instance_;
  }
  if ((((ModelDescription *)puVar12)->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  CoreML::Specification::FeatureDescription::FeatureDescription
            (&local_98,
             (FeatureDescription *)
             ((((ModelDescription *)puVar12)->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
            );
  if (m->description_ == (ModelDescription *)0x0) {
    uVar2 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar11);
    m->description_ = pMVar8;
  }
  pMVar8 = m->description_;
  pRVar3 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pFVar9 = (FeatureDescription *)pRVar3->elements[iVar1];
      goto LAB_001c268d;
    }
  }
  pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((pMVar8->traininginput_).super_RepeatedPtrFieldBase.arena_);
  pFVar9 = (FeatureDescription *)
           google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar8->traininginput_).super_RepeatedPtrFieldBase,pFVar9);
LAB_001c268d:
  CoreML::Specification::FeatureDescription::CopyFrom(pFVar9,&local_98);
  uVar2 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pFVar9->name_,(ulong)(pCVar4->target_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar10);
  CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}